

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

size_t get_step_filechar(uchar *s)

{
  size_t sVar1;
  
  sVar1 = GetUTF8Length(*s);
  return sVar1;
}

Assistant:

size_t get_step_filechar(const unsigned char *s)
{
#if (defined(_WIN32))
	unsigned char c = s[0];
	if ((c >= 0x81 && c <= 0x9f) || (c >= 0xe0 && c <= 0xfc))
	{
		c = s[1];
		if (c >= 0x40 && c <= 0xfc)
		{
			return 2;
		}
	}
	return 1;
#else
	return GetUTF8Length(*s);
#endif
}